

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

Maybe<kj::Own<capnp::ClientHook>_> __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::getMessageTarget
          (RpcConnectionState *this,Reader *target)

{
  CapTableReader *pCVar1;
  PipelineHook *pPVar2;
  Reader ops_00;
  Own<capnp::ClientHook> OVar3;
  Own<capnp::ClientHook> OVar4;
  char *pcVar5;
  size_t sVar6;
  uint uVar7;
  uint *puVar9;
  Disposer *extraout_RAX;
  mapped_type *pmVar10;
  Maybe<kj::Array<capnp::PipelineOp>_> *pMVar11;
  Disposer *extraout_RAX_00;
  char (*params) [80];
  Reader *in_RDX;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *extraout_RDX_01;
  ulong uVar12;
  PipelineOp *ptrCopy;
  undefined8 *puVar13;
  long *plVar14;
  bool bVar15;
  Own<capnp::ClientHook> OVar16;
  NullableValue<kj::Array<capnp::PipelineOp>_> ops;
  Reader promisedAnswer;
  Fault f;
  capnp local_248;
  undefined7 uStack_247;
  long *local_240;
  undefined8 uStack_238;
  undefined8 *local_230;
  String local_228;
  capnp local_208;
  long *local_200;
  undefined8 local_1f8;
  undefined8 *local_1f0;
  StructReader local_1e8;
  ListReader local_1b8;
  Exception local_188;
  ulong uVar8;
  
  uVar7 = (in_RDX->_reader).dataSize;
  if (uVar7 < 0x30) {
    if (0x1f < uVar7) {
      puVar9 = (uint *)(in_RDX->_reader).data;
      goto LAB_003b5aa3;
    }
    uVar7 = 0;
  }
  else {
    puVar9 = (uint *)(in_RDX->_reader).data;
    if ((short)puVar9[1] == 1) {
      bVar15 = (in_RDX->_reader).pointerCount == 0;
      local_188.ownFile.content.disposer = (ArrayDisposer *)(in_RDX->_reader).pointers;
      if (bVar15) {
        local_188.ownFile.content.disposer = (ArrayDisposer *)(WirePointer *)0x0;
      }
      params = (char (*) [80])0x7fffffff;
      if (!bVar15) {
        params = (char (*) [80])(ulong)(uint)(in_RDX->_reader).nestingLimit;
      }
      local_188.ownFile.content.ptr._0_4_ = 0;
      local_188.ownFile.content.ptr._4_4_ = 0;
      local_188.ownFile.content.size_._0_4_ = 0;
      local_188.ownFile.content.size_._4_4_ = 0;
      if (!bVar15) {
        local_188.ownFile.content.ptr._0_4_ = *(uint *)&(in_RDX->_reader).segment;
        local_188.ownFile.content.ptr._4_4_ = *(undefined4 *)((long)&(in_RDX->_reader).segment + 4);
        local_188.ownFile.content.size_._0_4_ = *(undefined4 *)&(in_RDX->_reader).capTable;
        local_188.ownFile.content.size_._4_4_ =
             *(undefined4 *)((long)&(in_RDX->_reader).capTable + 4);
      }
      local_188.file._0_4_ = (int)params;
      PointerReader::getStruct(&local_1e8,(PointerReader *)&local_188,(word *)0x0);
      if (local_1e8.dataSize < 0x20) {
        uVar7 = 0;
      }
      else {
        uVar7 = *local_1e8.data;
        local_188.ownFile.content.ptr._0_4_ = uVar7;
        if (0xf < uVar7) {
          pmVar10 = std::
                    unordered_map<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer>_>_>
                    ::operator[]((unordered_map<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer>_>_>
                                  *)&target[0x26]._reader.pointers,(key_type *)&local_188);
          goto LAB_003b5c16;
        }
      }
      pmVar10 = (mapped_type *)((long)target + (ulong)uVar7 * 0x50 + 0x238);
LAB_003b5c16:
      if (pmVar10->active == false) {
        _GLOBAL__N_1::RpcConnectionState::getMessageTarget((RpcConnectionState *)this);
        OVar16.ptr = extraout_RDX_01;
        OVar16.disposer = extraout_RAX_00;
        return (Maybe<kj::Own<capnp::ClientHook>_>)OVar16;
      }
      pPVar2 = (pmVar10->pipeline).ptr.ptr;
      if (pPVar2 == (PipelineHook *)0x0) {
        kj::_::Debug::makeDescription<char_const(&)[80]>
                  (&local_228,
                   (Debug *)
                   "\"Pipeline call on a request that returned no capabilities or was already closed.\""
                   ,
                   "Pipeline call on a request that returned no capabilities or was already closed."
                   ,params);
        kj::Exception::Exception
                  (&local_188,FAILED,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0x999,&local_228);
        newBrokenPipeline(&local_248,&local_188);
        plVar14 = local_240;
        puVar13 = (undefined8 *)CONCAT71(uStack_247,local_248);
        local_240 = (long *)0x0;
        kj::Exception::~Exception(&local_188);
        sVar6 = local_228.content.size_;
        pcVar5 = local_228.content.ptr;
        if (local_228.content.ptr != (char *)0x0) {
          local_228.content.ptr = (char *)0x0;
          local_228.content.size_ = 0;
          (**(local_228.content.disposer)->_vptr_ArrayDisposer)
                    (local_228.content.disposer,pcVar5,1,sVar6,sVar6,0);
        }
      }
      else {
        (**pPVar2->_vptr_PipelineHook)(&local_188);
        puVar13 = (undefined8 *)
                  CONCAT44(local_188.ownFile.content.ptr._4_4_,(uint)local_188.ownFile.content.ptr);
        plVar14 = (long *)CONCAT44(local_188.ownFile.content.size_._4_4_,
                                   (undefined4)local_188.ownFile.content.size_);
      }
      bVar15 = local_1e8.pointerCount == 0;
      local_188.ownFile.content.disposer = (ArrayDisposer *)local_1e8.pointers;
      if (bVar15) {
        local_188.ownFile.content.disposer = (ArrayDisposer *)(WirePointer *)0x0;
      }
      local_188.file._0_4_ = 0x7fffffff;
      if (!bVar15) {
        local_188.file._0_4_ = local_1e8.nestingLimit;
      }
      local_188.ownFile.content.ptr._0_4_ = 0;
      local_188.ownFile.content.ptr._4_4_ = 0;
      local_188.ownFile.content.size_._0_4_ = 0;
      local_188.ownFile.content.size_._4_4_ = 0;
      if (!bVar15) {
        local_188.ownFile.content.ptr._0_4_ = local_1e8.segment._0_4_;
        local_188.ownFile.content.ptr._4_4_ = local_1e8.segment._4_4_;
        local_188.ownFile.content.size_._0_4_ = local_1e8.capTable._0_4_;
        local_188.ownFile.content.size_._4_4_ = local_1e8.capTable._4_4_;
      }
      PointerReader::getList(&local_1b8,(PointerReader *)&local_188,INLINE_COMPOSITE,(word *)0x0);
      ops_00.reader.capTable = local_1b8.capTable;
      ops_00.reader.segment = local_1b8.segment;
      ops_00.reader.ptr = local_1b8.ptr;
      ops_00.reader.elementCount = local_1b8.elementCount;
      ops_00.reader.step = local_1b8.step;
      ops_00.reader.structDataSize = local_1b8.structDataSize;
      ops_00.reader.structPointerCount = local_1b8.structPointerCount;
      ops_00.reader.elementSize = local_1b8.elementSize;
      ops_00.reader._39_1_ = local_1b8._39_1_;
      ops_00.reader.nestingLimit = local_1b8.nestingLimit;
      ops_00.reader._44_4_ = local_1b8._44_4_;
      pMVar11 = toPipelineOps(ops_00);
      OVar4.disposer._1_7_ = (int7)((ulong)pMVar11 >> 8);
      OVar4.disposer._0_1_ = local_208;
      OVar4.ptr = extraout_RDX_00;
      local_248 = local_208;
      if (local_208 == (capnp)0x1) {
        local_240 = local_200;
        uStack_238 = local_1f8;
        local_230 = local_1f0;
        (**(code **)(*plVar14 + 8))(&local_188,plVar14,local_200,local_1f8);
        *(uint *)&(this->super_ErrorHandler)._vptr_ErrorHandler =
             (uint)local_188.ownFile.content.ptr;
        *(undefined4 *)((long)&(this->super_ErrorHandler)._vptr_ErrorHandler + 4) =
             local_188.ownFile.content.ptr._4_4_;
        *(undefined4 *)&(this->super_Refcounted).super_Disposer._vptr_Disposer =
             (undefined4)local_188.ownFile.content.size_;
        *(undefined4 *)((long)&(this->super_Refcounted).super_Disposer._vptr_Disposer + 4) =
             local_188.ownFile.content.size_._4_4_;
        if (local_200 != (long *)0x0) {
          local_240 = (long *)0x0;
          uStack_238 = 0;
          (**(code **)*local_1f0)(local_1f0,local_200,8,local_1f8,local_1f8,0);
        }
      }
      else {
        (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)0x0;
        (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
        if (plVar14 == (long *)0x0) {
          return (Maybe<kj::Own<capnp::ClientHook>_>)OVar4;
        }
      }
      OVar16 = (Own<capnp::ClientHook>)
               (**(code **)*puVar13)(puVar13,(long)plVar14 + *(long *)(*plVar14 + -0x10));
      return (Maybe<kj::Own<capnp::ClientHook>_>)OVar16;
    }
    if ((short)puVar9[1] != 0) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,char_const(&)[29],capnp::rpc::MessageTarget::Reader_const&>
                ((Fault *)&local_188,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x9a5,FAILED,(char *)0x0,"\"Unknown message target type.\", target",
                 (char (*) [29])"Unknown message target type.",in_RDX);
      goto LAB_003b5bb4;
    }
LAB_003b5aa3:
    uVar7 = *puVar9;
  }
  uVar8 = (ulong)uVar7;
  pCVar1 = target[9]._reader.capTable;
  uVar12 = ((long)target[9]._reader.data - (long)pCVar1 >> 3) * -0x3333333333333333;
  if ((uVar8 <= uVar12 && uVar12 - uVar8 != 0) &&
     (*(int *)&pCVar1[uVar8 * 5]._vptr_CapTableReader != 0)) {
    OVar16 = (Own<capnp::ClientHook>)
             (**(code **)(*pCVar1[uVar8 * 5 + 2]._vptr_CapTableReader + 0x20))(&local_188);
    (this->super_ErrorHandler)._vptr_ErrorHandler =
         (_func_int **)
         CONCAT44(local_188.ownFile.content.ptr._4_4_,(uint)local_188.ownFile.content.ptr);
    (this->super_Refcounted).super_Disposer._vptr_Disposer =
         (_func_int **)
         CONCAT44(local_188.ownFile.content.size_._4_4_,(undefined4)local_188.ownFile.content.size_)
    ;
    return (Maybe<kj::Own<capnp::ClientHook>_>)OVar16;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[43]>
            ((Fault *)&local_188,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
             ,0x986,FAILED,(char *)0x0,"\"Message target is not a current export ID.\"",
             (char (*) [43])"Message target is not a current export ID.");
LAB_003b5bb4:
  (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)0x0;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
  kj::_::Debug::Fault::~Fault((Fault *)&local_188);
  OVar3.ptr = extraout_RDX;
  OVar3.disposer = extraout_RAX;
  return (Maybe<kj::Own<capnp::ClientHook>_>)OVar3;
}

Assistant:

kj::Maybe<kj::Own<ClientHook>> getMessageTarget(const rpc::MessageTarget::Reader& target) {
    switch (target.which()) {
      case rpc::MessageTarget::IMPORTED_CAP: {
        KJ_IF_MAYBE(exp, exports.find(target.getImportedCap())) {
          return exp->clientHook->addRef();
        } else {
          KJ_FAIL_REQUIRE("Message target is not a current export ID.") {
            return nullptr;
          }
        }
        break;
      }